

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_sqrt(secp256k1_fe *a,secp256k1_fe *k)

{
  int iVar1;
  secp256k1_fe *in_RSI;
  bool bVar2;
  int v;
  secp256k1_fe r2;
  secp256k1_fe r1;
  secp256k1_fe *in_stack_00000178;
  secp256k1_fe *in_stack_00000180;
  secp256k1_fe local_60;
  secp256k1_fe local_38;
  secp256k1_fe *local_10;
  
  local_10 = in_RSI;
  iVar1 = secp256k1_fe_sqrt(in_stack_00000180,in_stack_00000178);
  if ((iVar1 == 0) != (local_10 == (secp256k1_fe *)0x0)) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xc84,"test condition failed: (v == 0) == (k == NULL)");
    abort();
  }
  if (local_10 != (secp256k1_fe *)0x0) {
    secp256k1_fe_impl_negate_unchecked(&local_60,&local_38,1);
    secp256k1_fe_impl_add(&local_38,local_10);
    secp256k1_fe_impl_add(&local_60,local_10);
    secp256k1_fe_impl_normalize(&local_38);
    secp256k1_fe_impl_normalize(&local_60);
    iVar1 = secp256k1_fe_impl_is_zero(&local_38);
    bVar2 = true;
    if (iVar1 == 0) {
      iVar1 = secp256k1_fe_impl_is_zero(&local_60);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
              ,0xc8b,"test condition failed: secp256k1_fe_is_zero(&r1) || secp256k1_fe_is_zero(&r2)"
             );
      abort();
    }
  }
  return;
}

Assistant:

static void test_sqrt(const secp256k1_fe *a, const secp256k1_fe *k) {
    secp256k1_fe r1, r2;
    int v = secp256k1_fe_sqrt(&r1, a);
    CHECK((v == 0) == (k == NULL));

    if (k != NULL) {
        /* Check that the returned root is +/- the given known answer */
        secp256k1_fe_negate(&r2, &r1, 1);
        secp256k1_fe_add(&r1, k); secp256k1_fe_add(&r2, k);
        secp256k1_fe_normalize(&r1); secp256k1_fe_normalize(&r2);
        CHECK(secp256k1_fe_is_zero(&r1) || secp256k1_fe_is_zero(&r2));
    }
}